

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalModulo<duckdb::ModuloOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pLVar1;
  pointer pDVar2;
  pointer *__ptr;
  LogicalType *arg;
  pointer this_00;
  _Head_base<0UL,_duckdb::DecimalArithmeticBindData_*,_false> local_58;
  scalar_function_t local_50;
  
  BindDecimalArithmetic<true>((duckdb *)&local_58,context,bound_function,arguments);
  pDVar2 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
           ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                         *)&local_58);
  if (pDVar2->check_overflow == true) {
    pLVar1 = *(pointer *)
              ((long)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data + 8);
    for (this_00 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_00 != pLVar1;
        this_00 = this_00 + 1) {
      LogicalType::LogicalType((LogicalType *)&local_50,DOUBLE);
      LogicalType::operator=(this_00,(LogicalType *)&local_50);
      LogicalType::~LogicalType((LogicalType *)&local_50);
    }
    LogicalType::LogicalType((LogicalType *)&local_50,DOUBLE);
    LogicalType::operator=
              (&(bound_function->super_BaseScalarFunction).return_type,(LogicalType *)&local_50);
    LogicalType::~LogicalType((LogicalType *)&local_50);
  }
  GetBinaryFunctionIgnoreZero<duckdb::ModuloOperator>
            (&local_50,(bound_function->super_BaseScalarFunction).return_type.physical_type_);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  operator=(&bound_function->function,&local_50);
  ::std::_Function_base::~_Function_base(&local_50.super__Function_base);
  *(DecimalArithmeticBindData **)this = local_58._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalModulo(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	auto bind_data = BindDecimalArithmetic<true>(context, bound_function, arguments);
	// now select the physical function to execute
	if (bind_data->check_overflow) {
		// fallback to DOUBLE if the decimal type is not guaranteed to fit within the max decimal width
		for (auto &arg : bound_function.arguments) {
			arg = LogicalType::DOUBLE;
		}
		bound_function.return_type = LogicalType::DOUBLE;
	}
	auto &result_type = bound_function.return_type;
	bound_function.function = GetBinaryFunctionIgnoreZero<OP>(result_type.InternalType());
	return std::move(bind_data);
}